

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT8 __thiscall VGMPlayer::LoadTags(VGMPlayer *this)

{
  uint uVar1;
  uint uVar2;
  UINT8 *pUVar3;
  char **ppcVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  string local_50;
  
  for (lVar6 = 0x2f8; lVar6 != 0x458; lVar6 = lVar6 + 0x20) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::operator=
              ((string *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar6),
               (string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this->_tagList[0] = (char *)0x0;
  uVar8 = (this->_fileHdr).gd3Ofs;
  if ((ulong)uVar8 != 0) {
    uVar1 = (this->_fileHdr).eofOfs;
    uVar5 = uVar8 + 0xc;
    if (uVar1 < uVar5 || uVar1 <= uVar8) {
      return 0xf3;
    }
    pUVar3 = this->_fileData;
    if (*(int *)(pUVar3 + uVar8) != 0x20336447) {
      return 0xf0;
    }
    uVar2 = *(uint *)(pUVar3 + (uVar8 + 4));
    this->_tagVer = uVar2;
    if ((uVar2 & 0xffffff00) != 0x100) {
      return 0xf1;
    }
    uVar2 = *(int *)(pUVar3 + (uVar8 + 8)) + uVar5;
    if (uVar1 <= *(int *)(pUVar3 + (uVar8 + 8)) + uVar5) {
      uVar2 = uVar1;
    }
    ppcVar4 = this->_tagList;
    uVar7 = 0;
    while ((uVar7 < 0xb && (uVar5 < uVar2))) {
      pUVar3 = this->_fileData;
      for (uVar8 = uVar5; (uVar8 < uVar2 && (*(short *)(pUVar3 + uVar8) != 0)); uVar8 = uVar8 + 2) {
      }
      GetUTF8String_abi_cxx11_(&local_50,this,pUVar3 + uVar5,pUVar3 + uVar8);
      std::__cxx11::string::operator=((string *)(this->_tagData + uVar7),(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      *ppcVar4 = _TAG_TYPE_LIST[uVar7];
      ppcVar4[1] = this->_tagData[uVar7]._M_dataplus._M_p;
      ppcVar4 = ppcVar4 + 2;
      uVar7 = uVar7 + 1;
      uVar5 = uVar8 + 2;
    }
    *ppcVar4 = (char *)0x0;
  }
  return '\0';
}

Assistant:

UINT8 VGMPlayer::LoadTags(void)
{
	size_t curTag;
	
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
		_tagData[curTag] = std::string();
	_tagList[0] = NULL;
	if (! _fileHdr.gd3Ofs)
		return 0x00;	// no GD3 tag present
	if (_fileHdr.gd3Ofs >= _fileHdr.eofOfs)
		return 0xF3;	// tag error (offset out-of-range)
	
	UINT32 curPos;
	UINT32 eotPos;
	
	if (_fileHdr.gd3Ofs + 0x0C > _fileHdr.eofOfs)	// separate check to catch overflows
		return 0xF3;	// tag error (GD3 header incomplete)
	if (memcmp(&_fileData[_fileHdr.gd3Ofs + 0x00], "Gd3 ", 4))
		return 0xF0;	// bad tag
	
	_tagVer = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x04]);
	if (_tagVer < 0x100 || _tagVer >= 0x200)
		return 0xF1;	// unsupported tag version
	
	eotPos = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x08]);
	curPos = _fileHdr.gd3Ofs + 0x0C;
	eotPos += curPos;
	if (eotPos > _fileHdr.eofOfs)
		eotPos = _fileHdr.eofOfs;
	
	const char **tagListEnd = _tagList;
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
	{
		UINT32 startPos = curPos;
		if (curPos >= eotPos)
			break;
		
		// search for UTF-16 L'\0' character
		while(curPos < eotPos && ReadLE16(&_fileData[curPos]) != L'\0')
			curPos += 0x02;
		_tagData[curTag] = GetUTF8String(&_fileData[startPos], &_fileData[curPos]);
		curPos += 0x02;	// skip '\0'
		
		*(tagListEnd++) = _TAG_TYPE_LIST[curTag];
		*(tagListEnd++) = _tagData[curTag].c_str();
	}
	
	*tagListEnd = NULL;
	
	return 0x00;
}